

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_x86.h
# Opt level: O0

int calculate_non_zero_count(__m128i mask)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined4 local_c8;
  int non_zero_count;
  __m128i mask1;
  __m128i mask0;
  __m128i mask_local;
  
  auVar3._8_8_ = in_XMM0_Qb;
  auVar3._0_8_ = in_XMM0_Qa;
  auVar2._8_8_ = in_XMM0_Qb;
  auVar2._0_8_ = in_XMM0_Qa;
  auVar2 = vpunpckhqdq_avx(auVar3,auVar2);
  auVar1._8_8_ = in_XMM0_Qb;
  auVar1._0_8_ = in_XMM0_Qa;
  auVar2 = vpmaxsw_avx(auVar2,auVar1);
  auVar1 = vpshufd_avx(auVar2,1);
  auVar2 = vpmaxsw_avx(auVar1,auVar2);
  auVar1 = vpsrld_avx(auVar2,ZEXT416(0x10));
  auVar2 = vpmaxsw_avx(auVar2,auVar1);
  local_c8 = auVar2._0_4_;
  return (local_c8 & 0xffff) + 1;
}

Assistant:

static inline int calculate_non_zero_count(__m128i mask) {
  __m128i mask0, mask1;
  int non_zero_count = 0;
  mask0 = _mm_unpackhi_epi64(mask, mask);
  mask1 = _mm_max_epi16(mask0, mask);
  mask0 = _mm_shuffle_epi32(mask1, 1);
  mask0 = _mm_max_epi16(mask0, mask1);
  mask1 = _mm_srli_epi32(mask0, 16);
  mask0 = _mm_max_epi16(mask0, mask1);
  non_zero_count = _mm_extract_epi16(mask0, 0) + 1;

  return non_zero_count;
}